

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O0

bool llvm::function_ref<bool(llvm::DWARFDebugLoclists::Entry_const&)>::
     callback_fn<llvm::DWARFDebugLoclists::dumpLocationList(llvm::DWARFDataExtractor_const&,unsigned_long*,unsigned_short,llvm::raw_ostream&,unsigned_long,llvm::MCRegisterInfo_const*,llvm::DWARFUnit*,llvm::DIDumpOptions,unsigned_int)::__0>
               (intptr_t callable,Entry *params)

{
  bool bVar1;
  Entry *params_local;
  intptr_t callable_local;
  
  bVar1 = DWARFDebugLoclists::dumpLocationList::anon_class_64_8_67d47438::operator()
                    ((anon_class_64_8_67d47438 *)callable,params);
  return bVar1;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params ...params) {
    return (*reinterpret_cast<Callable*>(callable))(
        std::forward<Params>(params)...);
  }